

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_varint_to_bytes(uint64_t value,uchar *bytes_out,size_t len,size_t *written)

{
  size_t sVar1;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  uint64_t value_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((bytes_out != (uchar *)0x0) && (sVar1 = varint_get_length(value), sVar1 <= len)) &&
     (written != (size_t *)0x0)) {
    sVar1 = varint_to_bytes(value,bytes_out);
    *written = sVar1;
    return 0;
  }
  return -2;
}

Assistant:

int wally_varint_to_bytes(uint64_t value, unsigned char *bytes_out, size_t len, size_t *written)
{
    if (written)
        *written = 0;
    if (!bytes_out || len < varint_get_length(value) || !written)
        return WALLY_EINVAL;
    *written = varint_to_bytes(value, bytes_out);
    return WALLY_OK;
}